

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_>::ComputeV2
          (TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_> *this,TPZFMatrix<float> *x,
          TPZFMatrix<float> *v2)

{
  bool bVar1;
  reference this_00;
  TPZFMatrix<float> *in_RDI;
  TPZFNMatrix<100,_float> v2_local;
  TPZFNMatrix<100,_float> Residual_local;
  int isub;
  const_iterator it;
  list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
  *in_stack_fffffffffffffb38;
  TPZDohrAssembly<float> *in_stack_fffffffffffffb40;
  TPZFNMatrix<100,_float> *in_stack_fffffffffffffb50;
  _Self in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb6c;
  TPZDohrAssembly<float> *in_stack_fffffffffffffb70;
  TPZFMatrix<float> *in_stack_fffffffffffffde0;
  TPZFMatrix<float> *in_stack_fffffffffffffde8;
  TPZDohrSubstructCondense<float> *in_stack_fffffffffffffdf0;
  _Self local_38;
  _List_node_base *local_30;
  int local_24;
  _List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_> local_20 [4];
  
  std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::_List_const_iterator
            (local_20);
  local_24 = 0;
  local_30 = (_List_node_base *)
             std::__cxx11::
             list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
             ::begin(in_stack_fffffffffffffb38);
  local_20[0]._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
         ::end(in_stack_fffffffffffffb38);
    bVar1 = std::operator!=(local_20,&local_38);
    if (!bVar1) break;
    TPZFNMatrix<100,_float>::TPZFNMatrix(in_stack_fffffffffffffb50);
    TPZFNMatrix<100,_float>::TPZFNMatrix(in_stack_fffffffffffffb50);
    in_stack_fffffffffffffb50 =
         (TPZFNMatrix<100,_float> *)
         TPZAutoPointer<TPZDohrAssembly<float>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembly<float>_> *)
                    &(in_RDI->fPivot).super_TPZVec<int>.fNAlloc);
    TPZDohrAssembly<float>::Extract
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
               (TPZFMatrix<float> *)in_stack_fffffffffffffb60._M_node,in_RDI);
    this_00 = std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::
              operator*((_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_> *)
                        in_stack_fffffffffffffb40);
    TPZAutoPointer<TPZDohrSubstructCondense<float>_>::operator->(this_00);
    TPZDohrSubstructCondense<float>::Contribute_v2_local
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    in_stack_fffffffffffffb40 =
         TPZAutoPointer<TPZDohrAssembly<float>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembly<float>_> *)
                    &(in_RDI->fPivot).super_TPZVec<int>.fNAlloc);
    TPZDohrAssembly<float>::Assemble
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
               (TPZFMatrix<float> *)in_stack_fffffffffffffb60._M_node,in_RDI);
    TPZFNMatrix<100,_float>::~TPZFNMatrix((TPZFNMatrix<100,_float> *)0x1f7e0a3);
    TPZFNMatrix<100,_float>::~TPZFNMatrix((TPZFNMatrix<100,_float> *)0x1f7e0b0);
    in_stack_fffffffffffffb60 =
         std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::operator++
                   (local_20,0);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::ComputeV2(const TPZFMatrix<TVar> &x, TPZFMatrix<TVar> &v2) const
{
	
	typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
	
	int isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		// contribute v2 deve ser uma tarefa inicializada mais cedo
		TPZFNMatrix<100,TVar> Residual_local,v2_local;
		fAssemble->Extract(isub,x,Residual_local);
		(*it)->Contribute_v2_local(Residual_local,v2_local);
#ifdef PZ_LOG
		{
			std::stringstream sout;
			sout << "Substructure " << isub << std::endl;
			Residual_local.Print("Residual local",sout);
            v2_local.Print("v2_local",sout);
			if (logger.isDebugEnabled())
			{
				LOGPZ_DEBUG(logger, sout.str());
			}
		}
#endif
		//		v2_local += v1_local;
		fAssemble->Assemble(isub,v2_local,v2);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		v2.Print("v2 vector",sout);
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
}